

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecialFormat.cpp
# Opt level: O1

TrackData *
GenerateSpectrumSpeedlockTrack
          (TrackData *__return_storage_ptr__,CylHead *cylhead,Track *track,int weak_offset,
          int weak_size)

{
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __first;
  pointer puVar1;
  int iVar2;
  Data *data;
  Sector *pSVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__x;
  BitBuffer *bitstream;
  pointer this;
  Data data1;
  TrackData *trackdata;
  size_t __len;
  BitstreamTrackBuilder bitbuf;
  FluxTrackBuilder fluxbuf;
  allocator_type local_145;
  int local_144;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_140;
  TrackData *local_128;
  long local_120;
  size_t local_118;
  CylHead *local_110;
  Track *local_108;
  pointer local_100;
  BitstreamTrackBuilder local_f8;
  FluxTrackBuilder local_78;
  
  local_144 = weak_size;
  local_128 = __return_storage_ptr__;
  local_110 = cylhead;
  FluxTrackBuilder::FluxTrackBuilder(&local_78,cylhead,_250K,MFM);
  TrackBuilder::addTrackStart(&local_78.super_TrackBuilder,false);
  BitstreamTrackBuilder::BitstreamTrackBuilder(&local_f8,_250K,MFM);
  TrackBuilder::addTrackStart(&local_f8.super_TrackBuilder,false);
  this = (track->m_sectors).super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
         super__Vector_impl_data._M_start;
  local_100 = (track->m_sectors).super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
              super__Vector_impl_data._M_finish;
  if (this != local_100) {
    local_120 = (long)weak_offset;
    local_118 = (size_t)local_144;
    local_108 = track;
    do {
      data = Sector::data_copy(this,0);
      pSVar3 = Track::operator[](track,1);
      if (this == pSVar3) {
        TrackBuilder::addSectorUpToData(&local_78.super_TrackBuilder,&this->header,this->dam);
        __first._M_current =
             (data->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        vector<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_140,__first,
                   (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )(__first._M_current + local_120),&local_145);
        TrackBuilder::addBlock(&local_78.super_TrackBuilder,(Data *)&local_140);
        if (local_140.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_140.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_140.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_140.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        FluxTrackBuilder::addWeakBlock(&local_78,local_144);
        puVar1 = (data->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar2 = Sector::size(this);
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        vector<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_140,
                   (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )(puVar1 + local_118 + local_120),
                   (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )(puVar1 + iVar2),&local_145);
        TrackBuilder::addBlock(&local_78.super_TrackBuilder,(Data *)&local_140);
        track = local_108;
        if (local_140.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_140.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_140.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_140.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
          track = local_108;
        }
      }
      else {
        TrackBuilder::addSector
                  (&local_78.super_TrackBuilder,&this->header,data,0x54,this->dam,false);
      }
      TrackBuilder::addSector
                (&local_f8.super_TrackBuilder,&this->header,data,0x2e,this->dam,this == pSVar3);
      pSVar3 = Track::operator[](track,5);
      if (this == pSVar3) {
        pSVar3 = Track::operator[](track,1);
        __x = &Sector::data_copy(pSVar3,0)->
               super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_140,__x);
        if (local_144 != 0) {
          memset(local_140.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_start + local_120,0xee,local_118);
        }
        TrackBuilder::addSector
                  (&local_f8.super_TrackBuilder,&pSVar3->header,(Data *)&local_140,0x2e,pSVar3->dam,
                   true);
        if (local_140.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_140.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_140.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_140.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
      }
      this = this + 1;
    } while (this != local_100);
  }
  TrackData::TrackData(local_128,local_110);
  bitstream = BitstreamTrackBuilder::buffer(&local_f8);
  TrackData::add(local_128,bitstream);
  if (local_f8.m_buffer.m_sync_losses.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.m_buffer.m_sync_losses.super__Vector_base<int,_std::allocator<int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_f8.m_buffer.m_sync_losses.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.m_buffer.m_sync_losses.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_f8.m_buffer.m_indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.m_buffer.m_indexes.super__Vector_base<int,_std::allocator<int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_f8.m_buffer.m_indexes.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.m_buffer.m_indexes.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_f8.m_buffer.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.m_buffer.m_data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f8.m_buffer.m_data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.m_buffer.m_data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_78.m_flux_times.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.m_flux_times.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.m_flux_times.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.m_flux_times.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return local_128;
}

Assistant:

TrackData GenerateSpectrumSpeedlockTrack(const CylHead& cylhead, const Track& track, int weak_offset, int weak_size)
{
#ifdef _DEBUG
    int temp_offset, temp_size;
    assert(IsSpectrumSpeedlockTrack(track, temp_offset, temp_size));
    assert(weak_offset == temp_offset && weak_size == temp_size);
#endif

    FluxTrackBuilder fluxbuf(cylhead, DataRate::_250K, Encoding::MFM);
    fluxbuf.addTrackStart();

    BitstreamTrackBuilder bitbuf(DataRate::_250K, Encoding::MFM);
    bitbuf.addTrackStart();

    for (auto& sector : track)
    {
        auto& data_copy = sector.data_copy();
        auto is_weak{ &sector == &track[1] };

        if (!is_weak)
            fluxbuf.addSector(sector.header, data_copy, 0x54, sector.dam);
        else
        {
            fluxbuf.addSectorUpToData(sector.header, sector.dam);
            fluxbuf.addBlock(Data(data_copy.begin(), data_copy.begin() + weak_offset));
            fluxbuf.addWeakBlock(weak_size);
            fluxbuf.addBlock(Data(
                data_copy.begin() + weak_offset + weak_size,
                data_copy.begin() + sector.size()));
        }

        bitbuf.addSector(sector.header, data_copy, 0x2e, sector.dam, is_weak);

        // Add duplicate weak sector half way around track.
        if (&sector == &track[5])
        {
            auto& sector1{ track[1] };
            auto data1{ sector1.data_copy() };
            std::fill(data1.begin() + weak_offset, data1.begin() + weak_offset + weak_size, uint8_t(0xee));
            bitbuf.addSector(sector1.header, data1, 0x2e, sector1.dam, true);
        }
    }

    TrackData trackdata(cylhead);
    trackdata.add(std::move(bitbuf.buffer()));
    //trackdata.add(FluxData({ fluxbuf.buffer() }));
    return trackdata;
}